

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

BaseNode * __thiscall
asmjit::_abi_1_10::BaseBuilder::addBefore(BaseBuilder *this,BaseNode *node,BaseNode *ref)

{
  NodeFlags NVar1;
  BaseNode *pBVar2;
  BaseNode **ppBVar3;
  
  if ((node->field_0).field_0._prev != (BaseNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/builder.cpp"
               ,0xd2,"!node->_prev");
  }
  if ((node->field_0).field_0._next != (BaseNode *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/builder.cpp"
               ,0xd3,"!node->_next");
  }
  NVar1 = (node->field_1)._any._nodeFlags;
  if ((char)NVar1 < '\0') {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/builder.cpp"
               ,0xd4,"!node->isActive()");
  }
  if ((char)(ref->field_1)._any._nodeFlags < '\0') {
    pBVar2 = (ref->field_0).field_0._prev;
    (node->field_0).field_0._prev = pBVar2;
    (node->field_0).field_0._next = ref;
    (node->field_1)._any._nodeFlags = NVar1 | kIsActive;
    if ((node->field_1)._any._nodeType == kSection) {
      this->_dirtySectionLinks = true;
    }
    (ref->field_0).field_0._prev = node;
    ppBVar3 = &(pBVar2->field_0).field_0._next;
    if (pBVar2 == (BaseNode *)0x0) {
      ppBVar3 = &this->_firstNode;
    }
    *ppBVar3 = node;
    return node;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/builder.cpp"
             ,0xd5,"ref->isActive()");
}

Assistant:

BaseNode* BaseBuilder::addBefore(BaseNode* node, BaseNode* ref) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());
  ASMJIT_ASSERT(ref->isActive());

  BaseNode* prev = ref->prev();
  BaseNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _firstNode = node;

  return node;
}